

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralizedSelfAdjointEigenSolver.h
# Opt level: O2

GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::compute
          (GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          MatrixType *matA,MatrixType *matB,int options)

{
  long lVar1;
  long lVar2;
  MatrixU MVar3;
  bool bVar4;
  uint uVar5;
  undefined1 local_88 [8];
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> cholB;
  Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_58;
  undefined1 local_48 [8];
  MatrixType matC;
  
  lVar1 = (matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (((lVar1 != (matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows) ||
      (lVar2 = (matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows, lVar2 != lVar1)) ||
     ((matB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      lVar2)) {
    __assert_fail("matA.cols()==matA.rows() && matB.rows()==matA.rows() && matB.cols()==matB.rows()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/GeneralizedSelfAdjointEigenSolver.h"
                  ,0xa5,
                  "GeneralizedSelfAdjointEigenSolver<MatrixType> &Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &, const MatrixType &, int) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (((options & 0xfffff83fU) != 0) || ((options & 0xc0U) == 0xc0)) {
LAB_0014a8bd:
    __assert_fail("(options&~(EigVecMask|GenEigMask))==0 && (options&EigVecMask)!=EigVecMask && ((options&GenEigMask)==0 || (options&GenEigMask)==Ax_lBx || (options&GenEigMask)==ABx_lx || (options&GenEigMask)==BAx_lx) && \"invalid option parameter\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/GeneralizedSelfAdjointEigenSolver.h"
                  ,0xaa,
                  "GeneralizedSelfAdjointEigenSolver<MatrixType> &Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::compute(const MatrixType &, const MatrixType &, int) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((((uint)options >> 8) - 1 < 2) || ((uint)options >> 8 == 4)) {
    uVar5 = options & 0x700;
    LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_88,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matB);
    if (uVar5 == 0x100) goto LAB_0014a759;
    if (uVar5 == 0x200) {
      local_58.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)matA;
      PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_48,
                 (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                  *)&local_58);
      cholB._32_8_ = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                               ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
      local_58 = (Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                  )operator*((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
                             (TriangularViewImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U,_Eigen::Dense>
                              *)&cholB.m_isInitialized);
      internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>,0>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_48,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_0>
                  *)&local_58);
      cholB._32_8_ = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                               ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
      local_58 = TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
                 ::operator*((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                              *)&cholB.m_isInitialized,
                             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
      internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::TriangularView<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_48,&local_58);
      SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
                 (uint)((options & 0x40U) == 0) * 0x40 + 0x40);
      if ((options & 0x40U) == 0) {
        MVar3 = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                          ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
        local_58.m_lhs.m_matrix.m_matrix = MVar3.m_matrix.m_matrix;
        TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
        ::solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                    *)&local_58,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
      }
    }
    else {
      if (uVar5 != 0x400) goto LAB_0014a883;
      local_58.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)matA;
      PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_48,
                 (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                  *)&local_58);
      cholB._32_8_ = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                               ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
      local_58 = (Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                  )operator*((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
                             (TriangularViewImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U,_Eigen::Dense>
                              *)&cholB.m_isInitialized);
      internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>,0>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_48,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_0>
                  *)&local_58);
      cholB._32_8_ = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                               ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
      local_58 = TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
                 ::operator*((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                              *)&cholB.m_isInitialized,
                             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
      internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::TriangularView<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_48,&local_58);
      SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
                 (uint)((options & 0x40U) == 0) * 0x40 + 0x40);
      if ((options & 0x40U) == 0) {
        cholB._32_8_ = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                                 ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
        local_58 = (Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_2U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                    )TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u,Eigen::Dense>::
                     operator*((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u,Eigen::Dense>
                                *)&cholB.m_isInitialized,
                               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
        internal::
        call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)this,
                   (Product<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                    *)&local_58);
      }
    }
  }
  else {
    if ((uint)options >> 8 != 0) goto LAB_0014a8bd;
    LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)local_88,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matB);
LAB_0014a759:
    bVar4 = (options & 0x40U) == 0;
    local_58.m_lhs.m_matrix.m_matrix = (MatrixTypeNested)(MatrixTypeNested)matA;
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::SelfAdjointView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_48,
               (EigenBase<Eigen::SelfAdjointView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&local_58);
    local_58.m_lhs.m_matrix.m_matrix =
         (MatrixTypeNested)
         LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                   ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
    TriangularViewImpl<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u,Eigen::Dense>::
    solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularViewImpl<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u,Eigen::Dense> *)
               &local_58,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
    local_58.m_lhs.m_matrix.m_matrix =
         (MatrixTypeNested)
         LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                   ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
    TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
    ::solveInPlace<2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                *)&local_58,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
    SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
               (uint)bVar4 * 0x40 + 0x40);
    if (bVar4) {
      MVar3 = LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixU
                        ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_88);
      local_58.m_lhs.m_matrix.m_matrix = MVar3.m_matrix.m_matrix;
      TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,2u,Eigen::Dense>
      ::solveInPlace<1,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((TriangularViewImpl<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,2u,Eigen::Dense>
                  *)&local_58,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    }
  }
  free((void *)local_48);
LAB_0014a883:
  free((void *)local_88);
  return this;
}

Assistant:

GeneralizedSelfAdjointEigenSolver<MatrixType>& GeneralizedSelfAdjointEigenSolver<MatrixType>::
compute(const MatrixType& matA, const MatrixType& matB, int options)
{
  eigen_assert(matA.cols()==matA.rows() && matB.rows()==matA.rows() && matB.cols()==matB.rows());
  eigen_assert((options&~(EigVecMask|GenEigMask))==0
          && (options&EigVecMask)!=EigVecMask
          && ((options&GenEigMask)==0 || (options&GenEigMask)==Ax_lBx
           || (options&GenEigMask)==ABx_lx || (options&GenEigMask)==BAx_lx)
          && "invalid option parameter");

  bool computeEigVecs = ((options&EigVecMask)==0) || ((options&EigVecMask)==ComputeEigenvectors);

  // Compute the cholesky decomposition of matB = L L' = U'U
  LLT<MatrixType> cholB(matB);

  int type = (options&GenEigMask);
  if(type==0)
    type = Ax_lBx;

  if(type==Ax_lBx)
  {
    // compute C = inv(L) A inv(L')
    MatrixType matC = matA.template selfadjointView<Lower>();
    cholB.matrixL().template solveInPlace<OnTheLeft>(matC);
    cholB.matrixU().template solveInPlace<OnTheRight>(matC);

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly );

    // transform back the eigen vectors: evecs = inv(U) * evecs
    if(computeEigVecs)
      cholB.matrixU().solveInPlace(Base::m_eivec);
  }
  else if(type==ABx_lx)
  {
    // compute C = L' A L
    MatrixType matC = matA.template selfadjointView<Lower>();
    matC = matC * cholB.matrixL();
    matC = cholB.matrixU() * matC;

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly);

    // transform back the eigen vectors: evecs = inv(U) * evecs
    if(computeEigVecs)
      cholB.matrixU().solveInPlace(Base::m_eivec);
  }
  else if(type==BAx_lx)
  {
    // compute C = L' A L
    MatrixType matC = matA.template selfadjointView<Lower>();
    matC = matC * cholB.matrixL();
    matC = cholB.matrixU() * matC;

    Base::compute(matC, computeEigVecs ? ComputeEigenvectors : EigenvaluesOnly);

    // transform back the eigen vectors: evecs = L * evecs
    if(computeEigVecs)
      Base::m_eivec = cholB.matrixL() * Base::m_eivec;
  }

  return *this;
}